

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btConvexConvexAlgorithm.h
# Opt level: O0

void __thiscall
btConvexConvexAlgorithm::getAllContactManifolds
          (btConvexConvexAlgorithm *this,btManifoldArray *manifoldArray)

{
  btPersistentManifold **in_RDI;
  btAlignedObjectArray<btPersistentManifold_*> *unaff_retaddr;
  
  if ((in_RDI[5] != (btPersistentManifold *)0x0) && (((ulong)in_RDI[4] & 1) != 0)) {
    btAlignedObjectArray<btPersistentManifold_*>::push_back(unaff_retaddr,in_RDI);
  }
  return;
}

Assistant:

virtual	void	getAllContactManifolds(btManifoldArray&	manifoldArray)
	{
		///should we use m_ownManifold to avoid adding duplicates?
		if (m_manifoldPtr && m_ownManifold)
			manifoldArray.push_back(m_manifoldPtr);
	}